

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::UntypedMapBase::DeleteNode(UntypedMapBase *this,NodeBase *node)

{
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_map_cc:110:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_map_cc:111:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_map_cc:111:57)>
  local_19;
  NodeBase *pNStack_18;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_map_cc:110:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_map_cc:111:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_map_cc:111:57)>
  destroy;
  NodeBase *node_local;
  UntypedMapBase *this_local;
  
  pNStack_18 = node;
  absl::lts_20250127::
  Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.cc:110:7),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.cc:111:7),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.cc:111:57)>
  ::Overload(&local_19);
  VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::UntypedMapBase::DeleteNode(google::protobuf::internal::NodeBase*)::__0,google::protobuf::internal::UntypedMapBase::DeleteNode(google::protobuf::internal::NodeBase*)::__1,google::protobuf::internal::UntypedMapBase::DeleteNode(google::protobuf::internal::NodeBase*)::__2>>
            (this,pNStack_18);
  VisitValue<absl::lts_20250127::Overload<google::protobuf::internal::UntypedMapBase::DeleteNode(google::protobuf::internal::NodeBase*)::__0,google::protobuf::internal::UntypedMapBase::DeleteNode(google::protobuf::internal::NodeBase*)::__1,google::protobuf::internal::UntypedMapBase::DeleteNode(google::protobuf::internal::NodeBase*)::__2>>
            (this,pNStack_18);
  DeallocNode(this,pNStack_18);
  return;
}

Assistant:

void UntypedMapBase::DeleteNode(NodeBase* node) {
  const auto destroy = absl::Overload{
      [](std::string* str) { str->~basic_string(); },
      [](MessageLite* msg) { msg->DestroyInstance(); }, [](void*) {}};
  VisitKey(node, destroy);
  VisitValue(node, destroy);
  DeallocNode(node);
}